

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_fileWatcher.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  element_type *peVar2;
  type tStack_78;
  char a;
  thread local_70;
  thread watch_t;
  undefined1 local_60 [8];
  shared_ptr<wmj::fileWatcher::fileWatcher> fw;
  allocator local_39;
  string local_38 [8];
  string file_name;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"./build/test.txt",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (1 < argc) {
    std::__cxx11::string::operator=(local_38,argv[1]);
  }
  std::make_shared<wmj::fileWatcher::fileWatcher,std::__cxx11::string&,main::__0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             (anon_class_1_0_00000001 *)local_38);
  peVar2 = std::
           __shared_ptr_access<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
  wmj::fileWatcher::fileWatcher::startWatch(peVar2);
  tStack_78.fw = (shared_ptr<wmj::fileWatcher::fileWatcher> *)local_60;
  std::thread::thread<main::__1,,void>(&local_70,&stack0xffffffffffffff88);
  while ((cVar1 = getch(), '\0' < cVar1 && (cVar1 != 'q'))) {
    if (cVar1 == 'o') {
      peVar2 = std::
               __shared_ptr_access<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      wmj::fileWatcher::fileWatcher::startWatch(peVar2);
    }
    if (cVar1 == 'p') {
      peVar2 = std::
               __shared_ptr_access<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      wmj::fileWatcher::fileWatcher::stopWatch(peVar2);
    }
  }
  std::__shared_ptr<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2> *)local_60);
  std::thread::join();
  std::thread::~thread(&local_70);
  std::shared_ptr<wmj::fileWatcher::fileWatcher>::~shared_ptr
            ((shared_ptr<wmj::fileWatcher::fileWatcher> *)local_60);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc,char **argv) {
    std::string file_name = "./build/test.txt";
    if (argc>=2){
        file_name = argv[1];
    }
    // 创建文件监视对象，设置回调函数
    auto fw = std::make_shared<wmj::fileWatcher::fileWatcher>(file_name, []() {
        std::cout << "file change" << std::endl;
    });
    // 开始文件监视
    fw->startWatch();
    // 建立文件监视进程
    std::thread watch_t([&fw]() {
        fw->run();
    });
    char a;
    while((a = getch()) > 0) {
        // 按q结束程序
        if(a == 'q') {
            break;
        }
        // 按o开始文件监视
        if(a == 'o') {
            fw->startWatch();
        }
        // 按p结束文件监视
        if(a == 'p') {
            fw->stopWatch();
        }
    }
    // 释放资源停止run函数
    fw.reset();
    // 等待文件监视进程结束
    watch_t.join();
    return 0;
}